

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

UBool hasValidTrailBytes(int32_t (*stateTable) [256],uint8_t state)

{
  uint uVar1;
  int iVar2;
  UBool UVar3;
  long lVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000031,state) << 10);
  uVar1 = *(uint *)((long)*stateTable + uVar5 + 0x284);
  if ((-1 < (int)uVar1 || (uVar1 & 0xf00000) == 0x700000) &&
     (uVar1 = *(uint *)((long)*stateTable + uVar5 + 0x104),
     -1 < (int)uVar1 || (uVar1 & 0xf00000) == 0x700000)) {
    lVar4 = 0;
    do {
      if (lVar4 == 0x100) {
        lVar4 = 0;
        while( true ) {
          if (lVar4 == 0x100) {
            return '\0';
          }
          iVar2 = *(int *)((long)*stateTable + lVar4 * 4 + uVar5);
          if ((-1 < iVar2) &&
             (UVar3 = hasValidTrailBytes(stateTable,(uint8_t)((uint)iVar2 >> 0x18)), UVar3 != '\0'))
          break;
          lVar4 = lVar4 + 1;
        }
        return '\x01';
      }
      uVar1 = *(uint *)((long)*stateTable + lVar4 * 4 + uVar5);
      lVar4 = lVar4 + 1;
    } while ((uVar1 & 0xf00000) == 0x700000 || -1 < (int)uVar1);
  }
  return '\x01';
}

Assistant:

static UBool
hasValidTrailBytes(const int32_t (*stateTable)[256], uint8_t state) {
    const int32_t *row=stateTable[state];
    int32_t b, entry;
    /* First test for final entries in this state for some commonly valid byte values. */
    entry=row[0xa1];
    if( !MBCS_ENTRY_IS_TRANSITION(entry) &&
        MBCS_ENTRY_FINAL_ACTION(entry)!=MBCS_STATE_ILLEGAL
    ) {
        return TRUE;
    }
    entry=row[0x41];
    if( !MBCS_ENTRY_IS_TRANSITION(entry) &&
        MBCS_ENTRY_FINAL_ACTION(entry)!=MBCS_STATE_ILLEGAL
    ) {
        return TRUE;
    }
    /* Then test for final entries in this state. */
    for(b=0; b<=0xff; ++b) {
        entry=row[b];
        if( !MBCS_ENTRY_IS_TRANSITION(entry) &&
            MBCS_ENTRY_FINAL_ACTION(entry)!=MBCS_STATE_ILLEGAL
        ) {
            return TRUE;
        }
    }
    /* Then recurse for transition entries. */
    for(b=0; b<=0xff; ++b) {
        entry=row[b];
        if( MBCS_ENTRY_IS_TRANSITION(entry) &&
            hasValidTrailBytes(stateTable, (uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry))
        ) {
            return TRUE;
        }
    }
    return FALSE;
}